

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

ostream * glu::TextureTestUtil::operator<<(ostream *str,LogGradientFmt *fmt)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(str,"(R: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fmt->valueMin->m_data[0]);
  poVar1 = std::operator<<(poVar1," -> ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fmt->valueMax->m_data[0]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"G: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fmt->valueMin->m_data[1]);
  poVar1 = std::operator<<(poVar1," -> ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fmt->valueMax->m_data[1]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"B: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fmt->valueMin->m_data[2]);
  poVar1 = std::operator<<(poVar1," -> ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fmt->valueMax->m_data[2]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"A: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fmt->valueMin->m_data[3]);
  poVar1 = std::operator<<(poVar1," -> ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fmt->valueMax->m_data[3]);
  poVar1 = std::operator<<(poVar1,")");
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const LogGradientFmt& fmt)
{
	return str << "(R: " << fmt.valueMin->x() << " -> " << fmt.valueMax->x() << ", "
			   <<  "G: " << fmt.valueMin->y() << " -> " << fmt.valueMax->y() << ", "
			   <<  "B: " << fmt.valueMin->z() << " -> " << fmt.valueMax->z() << ", "
			   <<  "A: " << fmt.valueMin->w() << " -> " << fmt.valueMax->w() << ")";
}